

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-slicer-crit.cpp
# Opt level: O0

bool mayBeTheVar(Value *val,string *var)

{
  StringRef RHS;
  StringRef LHS;
  bool bVar1;
  ret_type pGVar2;
  size_t sVar3;
  iterator __lhs;
  iterator name;
  GlobalVariable *G;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  undefined1 uVar4;
  _Self in_stack_ffffffffffffffb0;
  _Self in_stack_ffffffffffffffb8;
  size_t in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  bool local_1;
  
  pGVar2 = llvm::dyn_cast<llvm::GlobalVariable,llvm::Value_const>
                     ((Value *)in_stack_ffffffffffffffb0._M_node);
  if (pGVar2 == (ret_type)0x0) {
    std::
    map<const_llvm::Value_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_llvm::Value_*>,_std::allocator<std::pair<const_llvm::Value_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::find((map<const_llvm::Value_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_llvm::Value_*>,_std::allocator<std::pair<const_llvm::Value_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8),(key_type *)0x1e18aa);
    __lhs = std::
            map<const_llvm::Value_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_llvm::Value_*>,_std::allocator<std::pair<const_llvm::Value_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::end((map<const_llvm::Value_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_llvm::Value_*>,_std::allocator<std::pair<const_llvm::Value_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
    bVar1 = std::operator!=((_Self *)&stack0xffffffffffffffb8,(_Self *)&stack0xffffffffffffffb0);
    uVar4 = false;
    if (bVar1) {
      std::
      _Rb_tree_iterator<std::pair<const_llvm::Value_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator->((_Rb_tree_iterator<std::pair<const_llvm::Value_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)0x1e18e8);
      uVar4 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __lhs._M_node,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(uVar4,in_stack_ffffffffffffffa8));
    }
    if ((bool)uVar4 == false) {
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    sVar3 = llvm::Value::getName();
    llvm::StringRef::StringRef
              ((StringRef *)in_stack_ffffffffffffffb0._M_node,
               (string *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
    LHS.Length = sVar3;
    LHS.Data = in_stack_ffffffffffffffc8;
    RHS.Length = in_stack_ffffffffffffffc0;
    RHS.Data = (char *)in_stack_ffffffffffffffb8._M_node;
    local_1 = llvm::operator==(LHS,RHS);
  }
  return local_1;
}

Assistant:

static inline bool mayBeTheVar(const llvm::Value *val, const std::string &var) {
    // global variables have names, just compare it
    if (auto *G = llvm::dyn_cast<llvm::GlobalVariable>(val)) {
        return G->getName() == var;
    }

    // for other cases, we must relay on the information about allocas
    auto name = valuesToVariables.find(val);
    if (name != valuesToVariables.end() && name->second != var) {
        return false;
    }

    // either the var matches or we do not know the var,
    // which we must take as a match
    return true;
}